

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::MethodOptions::InternalSerializeWithCachedSizesToArray
          (MethodOptions *this,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  uint8 *puVar4;
  uint8 *in_RSI;
  MethodOptions *in_RDI;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 **in_stack_fffffffffffffec8;
  uint local_120;
  uint8 *local_110;
  EpsCopyOutputStream *in_stack_ffffffffffffff08;
  EpsCopyOutputStream *in_stack_ffffffffffffff10;
  UninterpretedOption *in_stack_ffffffffffffff18;
  EpsCopyOutputStream *stream_00;
  int in_stack_ffffffffffffff20;
  int start_field_number;
  ExtensionSet *this_00;
  
  this_00 = (ExtensionSet *)&in_RDI->_has_bits_;
  start_field_number = 0;
  uVar3 = ((HasBits<1UL> *)this_00)->has_bits_[0];
  local_110 = in_RSI;
  if ((uVar3 & 1) != 0) {
    io::EpsCopyOutputStream::EnsureSpace((EpsCopyOutputStream *)in_RDI,in_stack_fffffffffffffec8);
    bVar1 = _internal_deprecated(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(0x21,WIRETYPE_VARINT);
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,in_RSI);
    local_110 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,puVar4);
  }
  if ((uVar3 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace((EpsCopyOutputStream *)in_RDI,in_stack_fffffffffffffec8);
    _internal_idempotency_level(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(0x22,WIRETYPE_VARINT);
    io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_110);
    local_110 = io::CodedOutputStream::WriteVarint32SignExtendedToArray
                          ((int32)((ulong)in_RDI >> 0x20),(uint8 *)in_stack_fffffffffffffec8);
  }
  local_120 = 0;
  uVar3 = _internal_uninterpreted_option_size((MethodOptions *)0x5327f3);
  for (; local_120 < uVar3; local_120 = local_120 + 1) {
    io::EpsCopyOutputStream::EnsureSpace((EpsCopyOutputStream *)in_RDI,in_stack_fffffffffffffec8);
    _internal_uninterpreted_option(in_RDI,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    uVar2 = internal::WireFormatLite::MakeTag(999,WIRETYPE_LENGTH_DELIMITED);
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_110);
    uVar2 = UninterpretedOption::GetCachedSize((UninterpretedOption *)0x5328be);
    io::CodedOutputStream::WriteVarint32ToArray(uVar2,puVar4);
    local_110 = UninterpretedOption::InternalSerializeWithCachedSizesToArray
                          (in_stack_ffffffffffffff18,(uint8 *)in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff08);
  }
  local_110 = internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
                        (this_00,start_field_number,in_stack_ffffffffffffff20,
                         (uint8 *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    stream_00 = (EpsCopyOutputStream *)&in_RDI->_internal_metadata_;
    if (((uint)(((InternalMetadataWithArena *)stream_00)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)stream_00);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    local_110 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                          ((UnknownFieldSet *)this_00,
                           (uint8 *)CONCAT44(start_field_number,in_stack_ffffffffffffff20),stream_00
                          );
  }
  return local_110;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* MethodOptions::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.MethodOptions)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional bool deprecated = 33 [default = false];
  if (cached_has_bits & 0x00000001u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(33, this->_internal_deprecated(), target);
  }

  // optional .google.protobuf.MethodOptions.IdempotencyLevel idempotency_level = 34 [default = IDEMPOTENCY_UNKNOWN];
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      34, this->_internal_idempotency_level(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_uninterpreted_option_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(999, this->_internal_uninterpreted_option(i), target, stream);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.InternalSerializeWithCachedSizesToArray(
      1000, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.MethodOptions)
  return target;
}